

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

pair<unsigned_long,_unsigned_long>
farmhashna::WeakHashLen32WithSeeds
          (uint64_t w,uint64_t x,uint64_t y,uint64_t z,uint64_t a,uint64_t b)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  pair<unsigned_long,_unsigned_long> pVar3;
  uint64_t c;
  undefined8 in_stack_ffffffffffffffa8;
  int shift;
  uint64_t in_stack_ffffffffffffffb0;
  
  shift = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar1 = util::Rotate64(in_stack_ffffffffffffffb0,shift);
  uVar2 = util::Rotate64(in_stack_ffffffffffffffb0,shift);
  pVar3 = std::make_pair<unsigned_long,unsigned_long>
                    ((unsigned_long *)(in_R8 + in_RDI + in_RSI + in_RDX + in_RCX),
                     (unsigned_long *)(uVar1 + uVar2 + in_R8 + in_RDI));
  return pVar3;
}

Assistant:

STATIC_INLINE pair<uint64_t, uint64_t> WeakHashLen32WithSeeds(
    uint64_t w, uint64_t x, uint64_t y, uint64_t z, uint64_t a, uint64_t b) {
  a += w;
  b = Rotate(b + a + z, 21);
  uint64_t c = a;
  a += x;
  a += y;
  b += Rotate(a, 44);
  return make_pair(a + z, b + c);
}